

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O0

void __thiscall QGraphicsAnchorPrivate::unsetSpacing(QGraphicsAnchorPrivate *this)

{
  long lVar1;
  QGraphicsAnchorLayout *pQVar2;
  char *in_RDI;
  long in_FS_OFFSET;
  char *in_stack_ffffffffffffffd8;
  QMessageLogger *in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(in_RDI + 0x80) == 0) {
    QMessageLogger::QMessageLogger
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,(int)((ulong)in_RDI >> 0x20),
               in_RDI);
    QMessageLogger::warning
              (&stack0xffffffffffffffd8,"QGraphicsAnchor::setSpacing: The anchor does not exist.");
  }
  else {
    in_RDI[0x98] = in_RDI[0x98] & 0xfe;
    pQVar2 = QGraphicsAnchorLayoutPrivate::q_func(*(QGraphicsAnchorLayoutPrivate **)(in_RDI + 0x78))
    ;
    (*(pQVar2->super_QGraphicsLayout).super_QGraphicsLayoutItem._vptr_QGraphicsLayoutItem[7])();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsAnchorPrivate::unsetSpacing()
{
    if (!data) {
        qWarning("QGraphicsAnchor::setSpacing: The anchor does not exist.");
        return;
    }

    // Return to standard direction
    hasSize = false;

    layoutPrivate->q_func()->invalidate();
}